

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityType.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::EntityType::Encode(EntityType *this,KDataStream *stream)

{
  KDataStream::Write(stream,this->m_ui8EntityKind);
  KDataStream::Write(stream,this->m_ui8Domain);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Country);
  KDataStream::Write(stream,this->m_ui8Category);
  KDataStream::Write(stream,this->m_ui8SubCategory);
  KDataStream::Write(stream,this->m_ui8Specific);
  KDataStream::Write(stream,this->m_ui8Extra);
  return;
}

Assistant:

void EntityType::Encode( KDataStream & stream ) const
{
    stream << m_ui8EntityKind
           << m_ui8Domain
           << m_ui16Country
           << m_ui8Category
           << m_ui8SubCategory
           << m_ui8Specific
           << m_ui8Extra;
}